

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O1

ReadFileResult
anon_unknown.dwarf_12ad8aa::TestPresetOutputVerbosityHelper(VerbosityEnum *out,Value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  VerbosityEnum VVar4;
  String local_50;
  
  VVar4 = Default;
  if (value != (Value *)0x0) {
    bVar2 = Json::Value::isString(value);
    if (!bVar2) {
      return INVALID_PRESET;
    }
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 != 0) {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        VVar4 = Verbose;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 != 0) {
          return INVALID_PRESET;
        }
        VVar4 = Extra;
      }
    }
  }
  *out = VVar4;
  return READ_OK;
}

Assistant:

ReadFileResult TestPresetOutputVerbosityHelper(
  TestPreset::OutputOptions::VerbosityEnum& out, const Json::Value* value)
{
  if (!value) {
    out = TestPreset::OutputOptions::VerbosityEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "default") {
    out = TestPreset::OutputOptions::VerbosityEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "verbose") {
    out = TestPreset::OutputOptions::VerbosityEnum::Verbose;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "extra") {
    out = TestPreset::OutputOptions::VerbosityEnum::Extra;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}